

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O2

optional<slang::TimeScaleValue> slang::TimeScaleValue::fromLiteral(double value,TimeUnit unit)

{
  uint3 in_EAX;
  byte bVar1;
  
  if ((value != 1.0) || (NAN(value))) {
    if ((value != 10.0) || (NAN(value))) {
      if ((value != 100.0) || (NAN(value))) {
        bVar1 = 0;
        goto LAB_0054f7b3;
      }
      in_EAX = unit | 0x6400;
    }
    else {
      in_EAX = unit | 0xa00;
    }
  }
  else {
    in_EAX = unit | 0x100;
  }
  bVar1 = 1;
LAB_0054f7b3:
  return (_Optional_base<slang::TimeScaleValue,_true,_true>)(in_EAX & 0xffff | (uint3)bVar1 << 0x10)
  ;
}

Assistant:

std::optional<TimeScaleValue> TimeScaleValue::fromLiteral(double value, TimeUnit unit) {
    if (value == 1)
        return TimeScaleValue(unit, TimeScaleMagnitude::One);
    if (value == 10)
        return TimeScaleValue(unit, TimeScaleMagnitude::Ten);
    if (value == 100)
        return TimeScaleValue(unit, TimeScaleMagnitude::Hundred);

    return std::nullopt;
}